

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMI_DH_OBJECT_Unmarshal(TPMI_DH_OBJECT *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPM_RC result;
  BOOL flag_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMI_DH_OBJECT *target_local;
  
  target_local._4_4_ = UINT32_Unmarshal(target,buffer,size);
  if (target_local._4_4_ == 0) {
    if (*target == 0x40000007) {
      if (flag == 0) {
        target_local._4_4_ = 0x84;
      }
      else {
        target_local._4_4_ = 0;
      }
    }
    else if (((*target < 0x80000000) || (0x80000002 < *target)) &&
            ((*target < 0x81000000 || (0x81ffffff < *target)))) {
      target_local._4_4_ = 0x84;
    }
    else {
      target_local._4_4_ = 0;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMI_DH_OBJECT_Unmarshal(TPMI_DH_OBJECT *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
   if (*target == TPM_RH_NULL) {
        if(flag)
            return TPM_RC_SUCCESS;
        else
            return TPM_RC_VALUE;
    }
    if(((*target < TRANSIENT_FIRST) || (*target > TRANSIENT_LAST))
      &&((*target < PERSISTENT_FIRST) || (*target > PERSISTENT_LAST)))
    return TPM_RC_VALUE;
    return TPM_RC_SUCCESS;
}